

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync_tests.cpp
# Opt level: O0

void (anonymous_namespace)::TestPotentialDeadLockDetected<AnnotatedMixin<std::recursive_mutex>>
               (AnnotatedMixin<std::recursive_mutex> *mutex1,
               AnnotatedMixin<std::recursive_mutex> *mutex2)

{
  bool bVar1;
  long in_FS_OFFSET;
  logic_error *e;
  bool error_thrown;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2_1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1_1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  assertion_result *in_stack_fffffffffffffd28;
  undefined8 in_stack_fffffffffffffd38;
  const_string *in_stack_fffffffffffffd40;
  const_string *msg;
  char *in_stack_fffffffffffffd48;
  undefined1 *line_num;
  lazy_ostream *in_stack_fffffffffffffd50;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffffd58;
  unit_test_log_t *this;
  const_string local_208 [2];
  lazy_ostream local_1e8;
  undefined1 local_1b0 [16];
  const_string local_1a0;
  const_string local_190 [2];
  lazy_ostream local_170 [2];
  const_string local_c0 [2];
  lazy_ostream local_a0 [2];
  assertion_result local_80 [5];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffd18);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffd58,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffd50,
             in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40,
             (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffd38 >> 0x18,0));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffd18);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffd58,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffd50,
             in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40,
             (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffd38 >> 0x18,0));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffd18);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffd18);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd28,
               (pointer)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
               (unsigned_long)in_stack_fffffffffffffd18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffd58,
               (const_string *)in_stack_fffffffffffffd50,(size_t)in_stack_fffffffffffffd48,
               in_stack_fffffffffffffd40);
    LockStackEmpty();
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffd28,(bool)in_stack_fffffffffffffd27);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd28,
               (pointer)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
               (unsigned_long)in_stack_fffffffffffffd18);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
               (basic_cstring<const_char> *)in_stack_fffffffffffffd18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd28,
               (pointer)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
               (unsigned_long)in_stack_fffffffffffffd18);
    in_stack_fffffffffffffd18 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_80,local_a0,local_c0,0x14,CHECK,CHECK_PRED)
    ;
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffd18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffd18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffd18);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffd58,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffd50,
             in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40,
             (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffd38 >> 0x18,0));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffd18);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffd58,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffd50,
             in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40,
             (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffd38 >> 0x18,0));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffd18);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffd18);
  do {
    this = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd28,
               (pointer)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
               (unsigned_long)in_stack_fffffffffffffd18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this,(const_string *)in_stack_fffffffffffffd50,(size_t)in_stack_fffffffffffffd48,
               in_stack_fffffffffffffd40);
    LockStackEmpty();
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffd28,(bool)in_stack_fffffffffffffd27);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd28,
               (pointer)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
               (unsigned_long)in_stack_fffffffffffffd18);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
               (basic_cstring<const_char> *)in_stack_fffffffffffffd18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd28,
               (pointer)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
               (unsigned_long)in_stack_fffffffffffffd18);
    in_stack_fffffffffffffd18 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffeb0,local_170,local_190,0x1c,CHECK,
               CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffd18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffd18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    msg = &local_1a0;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd28,
               (pointer)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
               (unsigned_long)in_stack_fffffffffffffd18);
    line_num = local_1b0;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this,(const_string *)in_stack_fffffffffffffd50,(size_t)line_num,msg);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffd28,(bool)in_stack_fffffffffffffd27);
    in_stack_fffffffffffffd50 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd28,
               (pointer)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
               (unsigned_long)in_stack_fffffffffffffd18);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
               (basic_cstring<const_char> *)in_stack_fffffffffffffd18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd28,
               (pointer)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
               (unsigned_long)in_stack_fffffffffffffd18);
    in_stack_fffffffffffffd18 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffe38,&local_1e8,local_208,0x20,CHECK,
               CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffd18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffd18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TestPotentialDeadLockDetected(MutexType& mutex1, MutexType& mutex2)
{
    {
        LOCK2(mutex1, mutex2);
    }
    BOOST_CHECK(LockStackEmpty());
    bool error_thrown = false;
    try {
        LOCK2(mutex2, mutex1);
    } catch (const std::logic_error& e) {
        BOOST_CHECK_EQUAL(e.what(), "potential deadlock detected: mutex1 -> mutex2 -> mutex1");
        error_thrown = true;
    }
    BOOST_CHECK(LockStackEmpty());
    #ifdef DEBUG_LOCKORDER
    BOOST_CHECK(error_thrown);
    #else
    BOOST_CHECK(!error_thrown);
    #endif
}